

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

void __thiscall imrt::Station::generate_random_intensities(Station *this)

{
  int iVar1;
  _List_node_base *p_Var2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  pair<int,_int> pVar7;
  _List_node_base *p_Var8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  list<int,_std::allocator<int>_> in;
  vector<int,_std::allocator<int>_> values;
  _List_node_base local_70;
  long local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  clearIntensity(this);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->max_apertures + 1,(allocator_type *)&local_70);
  *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       0;
  if (0 < this->max_apertures) {
    lVar11 = 0;
    do {
      iVar4 = rand();
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11 + 1] = (int)((double)(iVar4 % (this->max_intensity + 1)) * 0.5);
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->max_apertures);
  }
  uVar10 = 0;
  while( true ) {
    iVar4 = Collimator::getXdim(this->collimator);
    if (iVar4 <= (int)uVar10) break;
    local_60 = 0;
    local_70._M_next = &local_70;
    local_70._M_prev = &local_70;
    pVar7 = Collimator::getActiveRange(this->collimator,(int)uVar10,this->angle);
    iVar4 = pVar7.first;
    if (-1 < iVar4) {
      local_58 = (ulong)pVar7 >> 0x20;
      local_50 = uVar10;
      if (iVar4 <= pVar7.second) {
        iVar4 = (pVar7.second - iVar4) + 1;
        do {
          iVar5 = rand();
          piVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar1 = this->max_apertures;
          p_Var8 = (_List_node_base *)operator_new(0x18);
          *(int *)&p_Var8[1]._M_next = piVar3[iVar5 % (iVar1 + 1)];
          std::__detail::_List_node_base::_M_hook(p_Var8);
          local_60 = local_60 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      std::__cxx11::list<int,_std::allocator<int>_>::sort
                ((list<int,_std::allocator<int>_> *)&local_70);
      uVar10 = local_50;
      uVar9 = local_58;
      while (local_70._M_next != &local_70) {
        uVar6 = rand();
        if ((uVar6 & 1) == 0) {
          change_intensity(this,(int)uVar10,(int)uVar9,(double)*(int *)&local_70._M_next[1]._M_next,
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )0x0);
          uVar9 = (ulong)((int)uVar9 - 1);
        }
        else {
          change_intensity(this,(int)uVar10,pVar7.first,(double)*(int *)&local_70._M_next[1]._M_next
                           ,(list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)0x0);
          pVar7.first = pVar7.first + 1;
          pVar7.second = 0;
        }
        p_Var8 = local_70._M_next;
        local_60 = local_60 + -1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var8);
      }
    }
    p_Var8 = local_70._M_next;
    while (p_Var8 != &local_70) {
      p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&p_Var8->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var8);
      p_Var8 = p_Var2;
    }
    uVar10 = (ulong)((int)uVar10 + 1);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Station::generate_random_intensities(){
    clearIntensity();

    vector<int> values(max_apertures+1);
    values[0] = 0;
    for(int i=1; i<max_apertures+1;i++){
      int in=rand()%(max_intensity+1)/2.0;
      values[i]=in;
    }

    for (int i=0; i < collimator.getXdim(); i++) {
      list<int> in;
      pair <int,int> aux = collimator.getActiveRange(i,angle);
      if(aux.first<0) continue;

      for (int j=aux.first; j<=aux.second; j++)
        in.push_back(values[rand()%(max_apertures+1)]);
      in.sort();

      int left=aux.first,right=aux.second;
      while(!in.empty()){
        if(rand()%2)
          change_intensity(i, left++, in.front());
        else
          change_intensity(i, right--, in.front());
        in.pop_front();
      }
    }
  //  printIntensity();
  }